

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_wString ON_SubDEndCapStyleToString(ON_SubDEndCapStyle subd_cap_style,bool bVerbose)

{
  wchar_t *s;
  undefined7 in_register_00000039;
  
  if (bVerbose < 5) {
    s = (wchar_t *)(&DAT_006ce668 + *(int *)(&DAT_006ce668 + (ulong)bVerbose * 4));
  }
  else {
    s = L"invalid";
  }
  ON_wString::ON_wString((ON_wString *)CONCAT71(in_register_00000039,subd_cap_style),s);
  return (ON_wString)(wchar_t *)CONCAT71(in_register_00000039,subd_cap_style);
}

Assistant:

const ON_wString ON_SubDEndCapStyleToString(
  ON_SubDEndCapStyle subd_cap_style,
  bool bVerbose
)
{
  const wchar_t* s;
  switch (subd_cap_style)
  {
  case ON_SubDEndCapStyle::Unset:
    s = L"Unset";
    break;
  case ON_SubDEndCapStyle::None:
    s = L"None";
    break;
  case ON_SubDEndCapStyle::Triangles:
    s = L"Triangles";
    break;
  case ON_SubDEndCapStyle::Quads:
    s = L"Quads";
    break;
  case ON_SubDEndCapStyle::Ngon:
    s = L"Ngon";
    break;
  default:
    s = L"invalid";
    break;
  }

  return ON_wString(s);
}